

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprintf.c
# Opt level: O2

int formatf(void *userp,_func_int_uchar_void_ptr *stream,char *format,__va_list_tag *ap_save)

{
  double dVar1;
  char cVar2;
  bool bVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  size_t sVar11;
  ulong uVar12;
  bool bVar13;
  long lVar14;
  anon_union_8_5_b978c7c5_for_val *paVar15;
  uint uVar16;
  ulong uVar17;
  uchar *__s;
  size_t sVar18;
  char *pcVar19;
  uint uVar20;
  FormatType FVar21;
  int *piVar22;
  anon_union_8_5_b978c7c5_for_val aVar23;
  uint *puVar24;
  anon_union_8_5_b978c7c5_for_val *paVar25;
  byte bVar26;
  uint uVar27;
  size_t sVar28;
  byte *buffer;
  uint uVar29;
  ulong uStack_1a30;
  uint local_1a1c;
  char *local_1a18;
  char *local_1a00;
  uint local_19ec;
  bool local_19e0;
  char *local_19d8;
  uint local_19d0;
  char *fmt;
  undefined8 uStack_19c0;
  undefined8 local_19b8;
  undefined8 uStack_19b0;
  curl_off_t num;
  __va_list_tag *local_1998;
  long local_1990;
  char work [328];
  va_input input [128];
  outsegment output [128];
  
  work[0] = '\0';
  work[1] = '\0';
  work[2] = '\0';
  work[3] = '\0';
  work[4] = '\0';
  work[5] = '\0';
  work[6] = '\0';
  work[7] = '\0';
  work[8] = '\0';
  work[9] = '\0';
  work[10] = '\0';
  work[0xb] = '\0';
  work[0xc] = '\0';
  work[0xd] = '\0';
  work[0xe] = '\0';
  work[0xf] = '\0';
  uVar27 = 0xffffffff;
  uVar16 = 0;
  local_19ec = 0xffffffff;
  local_19d0 = 0;
  local_1a00 = format;
  fmt = format;
  local_1998 = ap_save;
  iVar6 = 0;
switchD_001403c5_caseD_68:
  lVar14 = (long)(int)uVar16;
  if (*fmt == '%') {
    local_1a18 = fmt + 1;
    if (fmt[1] == '%') {
      if (local_1a18 + ~(ulong)local_1a00 != (char *)0x0) {
        if (0x7f < (int)uVar16) {
          return 0;
        }
        uVar16 = uVar16 + 1;
        output[lVar14].flags = 0x100000;
        output[lVar14].input = 0;
        output[lVar14].start = local_1a00;
        output[lVar14].outlen = (size_t)(local_1a18 + ~(ulong)local_1a00);
      }
      fmt = fmt + 2;
      local_1a00 = local_1a18;
      goto switchD_001403c5_caseD_68;
    }
    uVar29 = 0;
    bVar3 = false;
    uVar5 = uVar27;
    iVar9 = 1;
    fmt = local_1a18;
    local_1990 = lVar14;
    if (iVar6 != 1) {
      uVar5 = dollarstring(local_1a18,&fmt);
      if ((int)uVar5 < 0) {
        if (iVar6 == 2) {
          return 0;
        }
        bVar3 = false;
        uVar5 = uVar27;
        iVar9 = 1;
      }
      else {
        bVar3 = true;
        iVar9 = 2;
      }
    }
    bVar13 = true;
    uVar17 = 0;
    local_1a1c = 0;
LAB_00140187:
    uVar7 = (uint)uVar17;
    if (bVar13) {
      pcVar19 = fmt + 1;
      cVar2 = *fmt;
      switch(cVar2) {
      case ' ':
        uVar29 = uVar29 | 1;
        bVar13 = true;
        fmt = pcVar19;
        goto LAB_00140187;
      case '!':
      case '\"':
      case '$':
      case '%':
      case '&':
      case '\'':
      case '(':
      case ')':
      case ',':
      case '/':
switchD_001401b8_caseD_21:
        bVar13 = false;
        goto LAB_00140187;
      case '#':
        uVar29 = uVar29 | 8;
        bVar13 = true;
        fmt = pcVar19;
        goto LAB_00140187;
      case '*':
        uVar29 = uVar29 | 0x4000;
        bVar13 = true;
        uVar17 = 0xffffffff;
        fmt = pcVar19;
        if (bVar3) {
          uVar7 = dollarstring(pcVar19,&fmt);
          uVar17 = (ulong)uVar7;
          bVar13 = true;
          if ((int)uVar7 < 0) {
            return 0;
          }
        }
        goto LAB_00140187;
      case '+':
        uVar29 = uVar29 | 2;
        bVar13 = true;
        fmt = pcVar19;
        goto LAB_00140187;
      case '-':
        uVar29 = uVar29 & 0xfffffefb | 4;
        bVar13 = true;
        fmt = pcVar19;
        goto LAB_00140187;
      case '.':
        cVar2 = *pcVar19;
        if (cVar2 == '*') {
          uVar29 = uVar29 | 0x10000;
          fmt = fmt + 2;
          local_1a1c = uVar27;
          if ((bVar3) && (local_1a1c = dollarstring(fmt,&fmt), (int)local_1a1c < 0)) {
            return 0;
          }
        }
        else {
          if (cVar2 == '-') {
            pcVar19 = fmt + 2;
          }
          fmt = pcVar19;
          iVar6 = Curl_str_number(&fmt,&num,0x7fffffff);
          local_1a1c = -(uint)num;
          if (cVar2 != '-') {
            local_1a1c = (uint)num;
          }
          if (iVar6 != 0) {
            return 0;
          }
          uVar29 = uVar29 | 0x8000;
        }
        bVar13 = true;
        if ((~uVar29 & 0x18000) == 0) {
          return 0;
        }
        goto LAB_00140187;
      case '0':
        uVar29 = uVar29 | (~uVar29 & 4) << 6;
      case '1':
      case '2':
      case '3':
      case '4':
      case '5':
      case '6':
      case '7':
      case '8':
      case '9':
        uVar29 = uVar29 | 0x2000;
        iVar6 = Curl_str_number(&fmt,&num,0x7fffffff);
        uVar17 = (ulong)(uint)num;
        bVar13 = true;
        if (iVar6 != 0) {
          return 0;
        }
        goto LAB_00140187;
      }
      if (cVar2 == 'L') {
        uVar29 = uVar29 | 0x80;
        bVar13 = true;
        fmt = pcVar19;
      }
      else {
        if (cVar2 == 'O') goto LAB_0014030c;
        if (cVar2 != 'h') {
          if (cVar2 == 'l') {
            if ((uVar29 & 0x20) != 0) goto LAB_00140317;
          }
          else {
            if (cVar2 == 'q') {
LAB_00140317:
              uVar29 = uVar29 | 0x40;
              bVar13 = true;
              fmt = pcVar19;
              goto LAB_00140187;
            }
            if (cVar2 != 'z') goto switchD_001401b8_caseD_21;
          }
LAB_0014030c:
          uVar29 = uVar29 | 0x20;
          bVar13 = true;
          fmt = pcVar19;
          goto LAB_00140187;
        }
        uVar29 = uVar29 | 0x10;
        bVar13 = true;
        fmt = pcVar19;
      }
      goto LAB_00140187;
    }
    cVar2 = *fmt;
    FVar21 = FORMAT_PTR;
    iVar6 = iVar9;
    switch(cVar2) {
    case 'c':
      uVar29 = uVar29 | 0x20000;
      FVar21 = FORMAT_INT;
      break;
    case 'd':
    case 'i':
      if ((uVar29 & 0x40) == 0) {
        FVar21 = FORMAT_LONG - ((uVar29 & 0x20) == 0);
      }
      else {
        FVar21 = FORMAT_LONGLONG;
      }
      break;
    case 'e':
      uVar29 = uVar29 | 0x40000;
      goto LAB_001405ee;
    case 'f':
      goto LAB_001405ee;
    case 'g':
      uVar29 = uVar29 | 0x80000;
      goto LAB_001405ee;
    case 'h':
    case 'j':
    case 'k':
    case 'l':
    case 'm':
    case 'q':
    case 'r':
    case 't':
    case 'v':
    case 'w':
      goto switchD_001403c5_caseD_68;
    case 'n':
      FVar21 = FORMAT_INTPTR;
      break;
    case 'o':
      FVar21 = FORMAT_LONGU - ((uVar29 & 0x20) == 0);
      if ((uVar29 & 0x40) != 0) {
        FVar21 = FORMAT_LONGLONGU;
      }
      uVar29 = uVar29 | 0x600;
      break;
    case 'p':
      break;
    case 's':
LAB_0014059a:
      FVar21 = FORMAT_STRING;
      break;
    case 'u':
      FVar21 = FORMAT_LONGU - ((uVar29 & 0x20) == 0);
      if ((uVar29 & 0x40) != 0) {
        FVar21 = FORMAT_LONGLONGU;
      }
      uVar29 = uVar29 | 0x200;
      break;
    case 'x':
      FVar21 = FORMAT_LONGU - ((uVar29 & 0x20) == 0);
      if ((uVar29 & 0x40) != 0) {
        FVar21 = FORMAT_LONGLONGU;
      }
      uVar29 = uVar29 | 0xa00;
      break;
    default:
      if (cVar2 == 'E') {
        uVar29 = uVar29 | 0x41000;
      }
      else {
        if (cVar2 != 'G') {
          if (cVar2 == 'X') {
            FVar21 = FORMAT_LONGU - ((uVar29 & 0x20) == 0);
            if ((uVar29 & 0x40) != 0) {
              FVar21 = FORMAT_LONGLONGU;
            }
            uVar29 = uVar29 | 0x1a00;
            break;
          }
          if (cVar2 == 'S') {
            uVar29 = uVar29 | 8;
            goto LAB_0014059a;
          }
          goto switchD_001403c5_caseD_68;
        }
        uVar29 = uVar29 | 0x81000;
      }
LAB_001405ee:
      FVar21 = FORMAT_DOUBLE;
    }
    local_1a18 = local_1a18 + ~(ulong)local_1a00;
    if ((uVar29 >> 0xe & 1) != 0) {
      if ((int)uVar7 < 0) {
        uVar7 = local_19d0;
        local_19d0 = local_19d0 + 1;
      }
      else if (((byte)work[uVar17 >> 3] >> (uVar7 & 7) & 1) != 0) {
        return 0;
      }
      if (0x7f < (int)uVar7) {
        return 0;
      }
      if ((int)local_19ec < (int)uVar7) {
        local_19ec = uVar7;
      }
      input[(int)uVar7].type = FORMAT_WIDTH;
      work[(int)uVar7 / 8] = work[(int)uVar7 / 8] | (byte)(1 << ((byte)uVar7 & 7));
    }
    if ((uVar29 >> 0x10 & 1) != 0) {
      if ((int)local_1a1c < 0) {
        local_1a1c = local_19d0;
        local_19d0 = local_19d0 + 1;
      }
      else if (((byte)work[local_1a1c >> 3] >> (local_1a1c & 7) & 1) != 0) {
        return 0;
      }
      if (0x7f < (int)local_1a1c) {
        return 0;
      }
      if ((int)local_19ec < (int)local_1a1c) {
        local_19ec = local_1a1c;
      }
      input[(int)local_1a1c].type = FORMAT_PRECISION;
      work[(int)local_1a1c / 8] = work[(int)local_1a1c / 8] | (byte)(1 << ((byte)local_1a1c & 7));
    }
    uVar20 = uVar5;
    if ((int)uVar5 < 0) {
      uVar20 = local_19d0;
    }
    if (0x7f < (int)uVar20) {
      return 0;
    }
    input[(int)uVar20].type = FVar21;
    work[(int)uVar20 / 8] = work[(int)uVar20 / 8] | (byte)(1 << ((byte)uVar20 & 7));
    fmt = fmt + 1;
    if (0x7f < (int)uVar16) {
      return 0;
    }
    local_19d0 = local_19d0 - ((int)uVar5 >> 0x1f);
    uVar16 = uVar16 + 1;
    if ((int)local_19ec < (int)uVar20) {
      local_19ec = uVar20;
    }
    output[local_1990].input = uVar20;
    output[local_1990].flags = uVar29;
    output[local_1990].width = uVar7;
    output[local_1990].precision = local_1a1c;
    output[local_1990].start = local_1a00;
    output[local_1990].outlen = (size_t)local_1a18;
    local_1a00 = fmt;
    goto switchD_001403c5_caseD_68;
  }
  if (*fmt != '\0') goto code_r0x001403fb;
  if ((long)fmt - (long)local_1a00 != 0) {
    if (0x7f < (int)uVar16) {
      return 0;
    }
    uVar16 = uVar16 + 1;
    output[lVar14].flags = 0x100000;
    output[lVar14].input = 0;
    output[lVar14].start = local_1a00;
    output[lVar14].outlen = (long)fmt - (long)local_1a00;
  }
  if ((int)local_19ec < 0) {
    local_19ec = 0xffffffff;
  }
  paVar15 = &input[0].val;
  for (uVar17 = 0; (long)(int)local_19ec + 1U != uVar17; uVar17 = uVar17 + 1) {
    if (((byte)work[uVar17 >> 3 & 0x1fffffff] >> ((uint)uVar17 & 7) & 1) == 0) {
      return 0;
    }
    switch(((va_input *)(paVar15 + -1))->type) {
    case FORMAT_STRING:
    case FORMAT_PTR:
    case FORMAT_INTPTR:
    case FORMAT_LONG:
    case FORMAT_LONGLONG:
    case FORMAT_LONGU:
    case FORMAT_LONGLONGU:
      uVar27 = local_1998->gp_offset;
      if ((ulong)uVar27 < 0x29) {
        paVar25 = (anon_union_8_5_b978c7c5_for_val *)
                  ((ulong)uVar27 + (long)local_1998->reg_save_area);
        local_1998->gp_offset = uVar27 + 8;
      }
      else {
        paVar25 = (anon_union_8_5_b978c7c5_for_val *)local_1998->overflow_arg_area;
        local_1998->overflow_arg_area = paVar25 + 1;
      }
      aVar23 = *paVar25;
      break;
    case FORMAT_INT:
    case FORMAT_WIDTH:
    case FORMAT_PRECISION:
      uVar27 = local_1998->gp_offset;
      if ((ulong)uVar27 < 0x29) {
        piVar22 = (int *)((ulong)uVar27 + (long)local_1998->reg_save_area);
        local_1998->gp_offset = uVar27 + 8;
      }
      else {
        piVar22 = (int *)local_1998->overflow_arg_area;
        local_1998->overflow_arg_area = piVar22 + 2;
      }
      aVar23 = (anon_union_8_5_b978c7c5_for_val)(long)*piVar22;
      break;
    case FORMAT_INTU:
      uVar27 = local_1998->gp_offset;
      if ((ulong)uVar27 < 0x29) {
        puVar24 = (uint *)((ulong)uVar27 + (long)local_1998->reg_save_area);
        local_1998->gp_offset = uVar27 + 8;
      }
      else {
        puVar24 = (uint *)local_1998->overflow_arg_area;
        local_1998->overflow_arg_area = puVar24 + 2;
      }
      aVar23.nums._4_4_ = 0;
      aVar23.nums._0_4_ = *puVar24;
      break;
    case FORMAT_DOUBLE:
      uVar27 = local_1998->fp_offset;
      if ((ulong)uVar27 < 0xa1) {
        paVar25 = (anon_union_8_5_b978c7c5_for_val *)
                  ((ulong)uVar27 + (long)local_1998->reg_save_area);
        local_1998->fp_offset = uVar27 + 0x10;
      }
      else {
        paVar25 = (anon_union_8_5_b978c7c5_for_val *)local_1998->overflow_arg_area;
        local_1998->overflow_arg_area = paVar25 + 1;
      }
      *paVar15 = *paVar25;
    default:
      goto switchD_00140870_caseD_a;
    }
    *paVar15 = aVar23;
switchD_00140870_caseD_a:
    paVar15 = paVar15 + 2;
  }
  if ((int)uVar16 < 1) {
    uVar16 = 0;
  }
  uVar17 = 0;
  iVar6 = 0;
  local_19d8 = "0123456789abcdefghijklmnopqrstuvwxyz";
  do {
    if (uVar17 == uVar16) {
      return iVar6;
    }
    sVar18 = output[uVar17].outlen;
    local_1a1c = output[uVar17].flags;
    if (sVar18 != 0) {
      pcVar19 = output[uVar17].start;
      for (sVar28 = 0; iVar9 = (int)sVar18, sVar18 != sVar28; sVar28 = sVar28 + 1) {
        iVar9 = (int)sVar28;
        if (pcVar19[sVar28] == '\0') break;
        iVar8 = (*stream)(pcVar19[sVar28],userp);
        if (iVar8 != 0) {
          return iVar6 + iVar9;
        }
      }
      iVar6 = iVar6 + iVar9;
      if ((local_1a1c >> 0x14 & 1) == 0) goto LAB_001409d7;
      goto LAB_00141212;
    }
LAB_001409d7:
    uVar27 = output[uVar17].width;
    uVar5 = uVar27;
    if (((local_1a1c >> 0xe & 1) != 0) && (uVar5 = *(uint *)&input[(int)uVar27].val, (int)uVar5 < 0)
       ) {
      local_1a1c = local_1a1c & 0xfffffefb | 4;
      uVar5 = -uVar5;
    }
    if ((local_1a1c >> 0x10 & 1) == 0) {
      uVar29 = 0xffffffff;
      if ((short)local_1a1c < 0) {
        uVar29 = output[uVar17].precision;
      }
    }
    else {
      uVar29 = *(uint *)&input[output[uVar17].precision].val;
      if ((int)*(uint *)&input[output[uVar17].precision].val < 0) {
        uVar29 = 0xffffffff;
      }
    }
    uVar7 = output[uVar17].input;
    if (FORMAT_DOUBLE < input[uVar7].type) goto LAB_00141212;
    uVar20 = local_1a1c & 8;
    switch(input[uVar7].type) {
    case FORMAT_STRING:
      pcVar19 = input[uVar7].val.str;
      if (pcVar19 == (char *)0x0) {
        if (uVar29 == 0xffffffff || 4 < (int)uVar29) {
          local_1a1c = local_1a1c & 0xfffffff7;
          uVar20 = 0;
          pcVar19 = "(nil)";
          uVar12 = 5;
        }
        else {
          pcVar19 = "";
LAB_0014113e:
          uVar12 = 0;
        }
      }
      else if (uVar29 == 0xffffffff) {
        if (*pcVar19 == '\0') goto LAB_0014113e;
        uVar12 = strlen(pcVar19);
      }
      else {
        uVar12 = (ulong)(int)uVar29;
      }
      uVar10 = 0x7fffffff;
      if (uVar12 < 0x7fffffff) {
        uVar10 = uVar12;
      }
      if (uVar20 != 0) {
        iVar9 = (*stream)('\"',userp);
        if (iVar9 != 0) {
          return iVar6;
        }
        iVar6 = iVar6 + 1;
      }
      uVar5 = uVar5 - (int)uVar10;
      uVar27 = uVar5;
      if ((local_1a1c & 4) == 0) {
        uVar27 = ((int)uVar5 >> 0x1f & uVar5) - 1;
        for (; 0 < (int)uVar5; uVar5 = uVar5 - 1) {
          iVar9 = (*stream)(' ',userp);
          if (iVar9 != 0) {
            return iVar6;
          }
          iVar6 = iVar6 + 1;
        }
      }
      for (uVar10 = 0; iVar9 = (int)uVar12, uVar12 != uVar10; uVar10 = uVar10 + 1) {
        iVar9 = (int)uVar10;
        if (pcVar19[uVar10] == '\0') break;
        iVar8 = (*stream)(pcVar19[uVar10],userp);
        if (iVar8 != 0) {
          return iVar6 + iVar9;
        }
      }
      iVar6 = iVar9 + iVar6;
      if ((local_1a1c & 4) != 0) {
        for (; 0 < (int)uVar27; uVar27 = uVar27 - 1) {
          iVar9 = (*stream)(' ',userp);
          if (iVar9 != 0) {
            return iVar6;
          }
          iVar6 = iVar6 + 1;
        }
      }
      if (uVar20 != 0) {
        iVar9 = (*stream)('\"',userp);
        if (iVar9 != 0) {
          return iVar6;
        }
        iVar6 = iVar6 + 1;
      }
      break;
    case FORMAT_PTR:
      uVar12 = input[uVar7].val.numu;
      if (uVar12 == 0) {
        uVar5 = uVar5 - 5;
        uVar27 = uVar5;
        if ((local_1a1c & 4) != 0) {
          uVar27 = ((int)uVar5 >> 0x1f & uVar5) - 1;
          for (; 0 < (int)uVar5; uVar5 = uVar5 - 1) {
            iVar9 = (*stream)(' ',userp);
            if (iVar9 != 0) {
              return iVar6;
            }
            iVar6 = iVar6 + 1;
          }
        }
        iVar9 = iVar6 + 5;
        for (lVar14 = 0; lVar14 != 5; lVar14 = lVar14 + 1) {
          iVar8 = (*stream)("(nil)"[lVar14],userp);
          if (iVar8 != 0) {
            return iVar6 + (int)lVar14;
          }
        }
        iVar6 = iVar9;
        if ((local_1a1c & 4) == 0) {
          for (; iVar6 = iVar9, 0 < (int)uVar27; uVar27 = uVar27 - 1) {
            iVar6 = (*stream)(' ',userp);
            if (iVar6 != 0) {
              return iVar9;
            }
            iVar9 = iVar9 + 1;
          }
        }
        break;
      }
      local_19d8 = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ";
      if ((local_1a1c >> 0xc & 1) == 0) {
        local_19d8 = "0123456789abcdefghijklmnopqrstuvwxyz";
      }
      bVar26 = 1;
      bVar3 = false;
      uStack_1a30 = 0x10;
      bVar4 = 1;
      goto LAB_00140d8a;
    case FORMAT_INTPTR:
      if ((local_1a1c & 0x40) == 0) {
        if ((local_1a1c & 0x20) == 0) {
          if ((local_1a1c & 0x10) == 0) {
            *(int *)input[uVar7].val.str = iVar6;
          }
          else {
            *(short *)input[uVar7].val.str = (short)iVar6;
          }
        }
        else {
          *(long *)input[uVar7].val.str = (long)iVar6;
        }
      }
      else {
        *(long *)input[uVar7].val.str = (long)iVar6;
      }
      break;
    default:
      goto switchD_00140a7d_caseD_3;
    case FORMAT_INTU:
    case FORMAT_LONGU:
    case FORMAT_LONGLONGU:
      local_1a1c = local_1a1c | 0x200;
switchD_00140a7d_caseD_3:
      uVar12 = input[uVar7].val.numu;
      if ((local_1a1c >> 0x11 & 1) == 0) {
        bVar4 = (byte)(uVar20 >> 3);
        if ((local_1a1c >> 10 & 1) == 0) {
          if ((local_1a1c >> 0xb & 1) != 0) {
            local_19d8 = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ";
            if ((local_1a1c >> 0xc & 1) == 0) {
              local_19d8 = "0123456789abcdefghijklmnopqrstuvwxyz";
            }
            bVar26 = 1;
            bVar3 = false;
            uStack_1a30 = 0x10;
            goto LAB_00140d8a;
          }
          uVar10 = -uVar12;
          if (0 < (long)uVar12) {
            uVar10 = uVar12;
          }
          local_19e0 = (local_1a1c >> 9 & 1) == 0;
          if (!local_19e0) {
            uVar10 = uVar12;
          }
          local_19e0 = local_19e0 && (long)uVar12 < 0;
          if (uVar29 == 0xffffffff) {
            uVar29 = 1;
          }
          lVar14 = 0x144;
          for (; uVar10 != 0; uVar10 = uVar10 / 10) {
            work[lVar14] = (byte)(uVar10 % 10) | 0x30;
            lVar14 = lVar14 + -1;
          }
          bVar26 = 0;
          bVar3 = false;
        }
        else {
          bVar3 = true;
          bVar26 = 0;
          uStack_1a30 = 8;
LAB_00140d8a:
          if (uVar29 == 0xffffffff) {
            uVar29 = 1;
          }
          lVar14 = 0x144;
          for (; uVar12 != 0; uVar12 = uVar12 / uStack_1a30) {
            work[lVar14] = local_19d8[uVar12 & uStack_1a30 - 1];
            lVar14 = lVar14 + -1;
          }
          local_19e0 = false;
        }
        iVar9 = 0x144 - (int)lVar14;
        iVar8 = uVar5 - iVar9;
        iVar9 = uVar29 - iVar9;
        if (((bVar3) && (bVar4 != 0)) && (iVar9 < 1)) {
          work[lVar14] = '0';
          lVar14 = lVar14 + -1;
          iVar8 = iVar8 + -1;
        }
        else if (0 < iVar9) {
          for (; (0 < (int)((uVar29 - 0x144) + (int)lVar14) && (-1 < lVar14)); lVar14 = lVar14 + -1)
          {
            work[lVar14] = '0';
          }
          iVar8 = iVar8 - iVar9;
        }
        iVar9 = iVar8 + -2;
        if ((bVar26 & bVar4) == 0) {
          iVar9 = iVar8;
        }
        uVar5 = iVar9 - (uint)(byte)((local_1a1c & 3) != 0 | local_19e0);
        uVar27 = uVar5;
        if ((local_1a1c & 0x104) == 0) {
          uVar27 = ((int)uVar5 >> 0x1f & uVar5) - 1;
          for (; 0 < (int)uVar5; uVar5 = uVar5 - 1) {
            iVar9 = (*stream)(' ',userp);
            if (iVar9 != 0) {
              return iVar6;
            }
            iVar6 = iVar6 + 1;
          }
        }
        if (local_19e0 == false) {
          if ((local_1a1c & 2) != 0) {
            uStack_1a30._0_1_ = '+';
            goto LAB_00140eb9;
          }
          if ((local_1a1c & 1) != 0) {
            uStack_1a30._0_1_ = ' ';
            goto LAB_00140eb9;
          }
        }
        else {
          uStack_1a30._0_1_ = '-';
LAB_00140eb9:
          iVar9 = (*stream)((uchar)uStack_1a30,userp);
          if (iVar9 != 0) {
            return iVar6;
          }
          iVar6 = iVar6 + 1;
        }
        if ((bVar26 & bVar4) != 0) {
          iVar9 = (*stream)('0',userp);
          if (iVar9 != 0) {
            return iVar6;
          }
          if ((local_1a1c >> 0xc & 1) == 0) {
            uStack_1a30._0_1_ = 'x';
          }
          else {
            uStack_1a30._0_1_ = 'X';
          }
          iVar9 = (*stream)((uchar)uStack_1a30,userp);
          if (iVar9 != 0) {
            return iVar6 + 1;
          }
          iVar6 = iVar6 + 2;
        }
        uVar5 = uVar27;
        if ((local_1a1c & 0x104) == 0x100) {
          uVar5 = ((int)uVar27 >> 0x1f & uVar27) - 1;
          for (; 0 < (int)uVar27; uVar27 = uVar27 - 1) {
            iVar9 = (*stream)('0',userp);
            if (iVar9 != 0) {
              return iVar6;
            }
            iVar6 = iVar6 + 1;
          }
        }
        for (; lVar14 < 0x144; lVar14 = lVar14 + 1) {
          iVar9 = (*stream)(work[lVar14 + 1],userp);
          if (iVar9 != 0) {
            return iVar6;
          }
          iVar6 = iVar6 + 1;
        }
        if ((local_1a1c & 4) != 0) {
          for (iVar9 = 0; 0 < (int)(uVar5 + iVar9); iVar9 = iVar9 + -1) {
            iVar8 = (*stream)(' ',userp);
            if (iVar8 != 0) {
              return iVar6 - iVar9;
            }
          }
          iVar6 = iVar6 - iVar9;
        }
      }
      else {
        if ((local_1a1c & 4) == 0) {
          for (; 1 < (int)uVar5; uVar5 = uVar5 - 1) {
            iVar9 = (*stream)(' ',userp);
            if (iVar9 != 0) {
              return iVar6;
            }
            iVar6 = iVar6 + 1;
          }
          uVar5 = uVar5 - 1;
        }
        iVar9 = (*stream)((uchar)uVar12,userp);
        if (iVar9 != 0) {
          return iVar6;
        }
        iVar6 = iVar6 + 1;
        if ((local_1a1c & 4) != 0) {
          for (; 1 < (int)uVar5; uVar5 = uVar5 - 1) {
            iVar9 = (*stream)(' ',userp);
            if (iVar9 != 0) {
              return iVar6;
            }
            iVar6 = iVar6 + 1;
          }
        }
      }
      break;
    case FORMAT_DOUBLE:
      local_19b8 = 0;
      uStack_19b0 = 0;
      fmt = (char *)0x25;
      uStack_19c0 = 0;
      sVar11 = strlen((char *)&fmt);
      if ((local_1a1c >> 0xd & 1) == 0) {
        uVar27 = uVar5;
      }
      if ((short)local_1a1c < 0) {
        uVar29 = output[uVar17].precision;
      }
      buffer = (byte *)((long)&fmt + 1);
      if ((local_1a1c & 4) != 0) {
        fmt._0_2_ = CONCAT11(0x2d,fmt._0_1_);
        buffer = (byte *)((long)&fmt + 2);
      }
      if ((local_1a1c & 2) != 0) {
        *buffer = 0x2b;
        buffer = buffer + 1;
      }
      if ((local_1a1c & 1) != 0) {
        *buffer = 0x20;
        buffer = buffer + 1;
      }
      if (uVar20 != 0) {
        *buffer = 0x23;
        buffer = buffer + 1;
      }
      sVar18 = 0x20 - sVar11;
      *buffer = 0;
      if (-1 < (int)uVar27) {
        if (0x144 < uVar27) {
          uVar27 = 0x145;
        }
        iVar9 = curl_msnprintf((char *)buffer,sVar18,"%d",(ulong)uVar27);
        buffer = buffer + iVar9;
        sVar18 = sVar18 - (long)iVar9;
      }
      if (-1 < (int)uVar29) {
        if (0x145 < uVar29) {
          uVar29 = 0x144;
        }
        iVar9 = 0x145 - uVar27;
        if ((int)uVar27 < (int)uVar29) {
          iVar9 = 0x145;
        }
        dVar1 = input[uVar7].val.dnum;
        if ((int)uVar27 < 1) {
          iVar9 = 0x145;
        }
        for (; 10.0 <= dVar1; dVar1 = dVar1 / 10.0) {
          iVar9 = iVar9 + -1;
        }
        uVar27 = iVar9 - 1;
        if ((int)uVar29 <= iVar9) {
          uVar27 = uVar29;
        }
        if ((int)uVar27 < 1) {
          uVar27 = 0;
        }
        iVar9 = curl_msnprintf((char *)buffer,sVar18,".%d",(ulong)uVar27);
        buffer = buffer + iVar9;
      }
      if ((local_1a1c & 0x20) != 0) {
        *buffer = 0x6c;
        buffer = buffer + 1;
      }
      if ((local_1a1c >> 0x12 & 1) == 0) {
        bVar4 = 0x66;
        if ((local_1a1c >> 0x13 & 1) != 0) {
          bVar4 = ((local_1a1c >> 0xc & 1) == 0) << 5 | 0x47;
        }
      }
      else {
        bVar4 = ((local_1a1c >> 0xc & 1) == 0) << 5 | 0x45;
      }
      *buffer = bVar4;
      buffer[1] = 0;
      __s = (uchar *)work;
      snprintf((char *)__s,0x146,(char *)&fmt,(int)input[uVar7].val.nums);
      for (; *__s != '\0'; __s = __s + 1) {
        iVar9 = (*stream)(*__s,userp);
        if (iVar9 != 0) {
          return iVar6;
        }
        iVar6 = iVar6 + 1;
      }
    }
LAB_00141212:
    uVar17 = uVar17 + 1;
  } while( true );
code_r0x001403fb:
  fmt = fmt + 1;
  goto switchD_001403c5_caseD_68;
}

Assistant:

static int formatf(
  void *userp, /* untouched by format(), just sent to the stream() function in
                  the second argument */
  /* function pointer called for each output character */
  int (*stream)(unsigned char, void *),
  const char *format,    /* %-formatted string */
  va_list ap_save) /* list of parameters */
{
  static const char nilstr[] = "(nil)";
  const char *digits = lower_digits;   /* Base-36 digits for numbers.  */
  int done = 0;   /* number of characters written  */
  int i;
  int ocount = 0; /* number of output segments */
  int icount = 0; /* number of input arguments */

  struct outsegment output[MAX_SEGMENTS];
  struct va_input input[MAX_PARAMETERS];
  char work[BUFFSIZE + 2];

  /* 'workend' points to the final buffer byte position, but with an extra
     byte as margin to avoid the (FALSE?) warning Coverity gives us
     otherwise */
  char *workend = &work[BUFFSIZE - 2];

  /* Parse the format string */
  if(parsefmt(format, output, input, &ocount, &icount, ap_save))
    return 0;

  for(i = 0; i < ocount; i++) {
    struct outsegment *optr = &output[i];
    struct va_input *iptr;
    bool is_alt;            /* Format spec modifiers.  */
    int width;              /* Width of a field.  */
    int prec;               /* Precision of a field.  */
    bool is_neg;            /* Decimal integer is negative.  */
    unsigned long base;     /* Base of a number to be written.  */
    mp_uintmax_t num;       /* Integral values to be written.  */
    mp_intmax_t signed_num; /* Used to convert negative in positive.  */
    char *w;
    size_t outlen = optr->outlen;
    unsigned int flags = optr->flags;

    if(outlen) {
      const char *str = optr->start;
      for(; outlen && *str; outlen--)
        OUTCHAR(*str++);
      if(optr->flags & FLAGS_SUBSTR)
        /* this is just a substring */
        continue;
    }

    /* pick up the specified width */
    if(flags & FLAGS_WIDTHPARAM) {
      width = (int)input[optr->width].val.nums;
      if(width < 0) {
        /* "A negative field width is taken as a '-' flag followed by a
           positive field width." */
        if(width == INT_MIN)
          width = INT_MAX;
        else
          width = -width;
        flags |= FLAGS_LEFT;
        flags &= ~(unsigned int)FLAGS_PAD_NIL;
      }
    }
    else
      width = optr->width;

    /* pick up the specified precision */
    if(flags & FLAGS_PRECPARAM) {
      prec = (int)input[optr->precision].val.nums;
      if(prec < 0)
        /* "A negative precision is taken as if the precision were
           omitted." */
        prec = -1;
    }
    else if(flags & FLAGS_PREC)
      prec = optr->precision;
    else
      prec = -1;

    is_alt = (flags & FLAGS_ALT) ? 1 : 0;
    iptr = &input[optr->input];

    switch(iptr->type) {
    case FORMAT_INTU:
    case FORMAT_LONGU:
    case FORMAT_LONGLONGU:
      flags |= FLAGS_UNSIGNED;
      FALLTHROUGH();
    case FORMAT_INT:
    case FORMAT_LONG:
    case FORMAT_LONGLONG:
      num = iptr->val.numu;
      if(flags & FLAGS_CHAR) {
        /* Character.  */
        if(!(flags & FLAGS_LEFT))
          while(--width > 0)
            OUTCHAR(' ');
        OUTCHAR((char) num);
        if(flags & FLAGS_LEFT)
          while(--width > 0)
            OUTCHAR(' ');
        break;
      }
      if(flags & FLAGS_OCTAL) {
        /* Octal unsigned integer */
        base = 8;
        is_neg = FALSE;
      }
      else if(flags & FLAGS_HEX) {
        /* Hexadecimal unsigned integer */
        digits = (flags & FLAGS_UPPER) ? upper_digits : lower_digits;
        base = 16;
        is_neg = FALSE;
      }
      else if(flags & FLAGS_UNSIGNED) {
        /* Decimal unsigned integer */
        base = 10;
        is_neg = FALSE;
      }
      else {
        /* Decimal integer.  */
        base = 10;

        is_neg = (iptr->val.nums < (mp_intmax_t)0);
        if(is_neg) {
          /* signed_num might fail to hold absolute negative minimum by 1 */
          signed_num = iptr->val.nums + (mp_intmax_t)1;
          signed_num = -signed_num;
          num = (mp_uintmax_t)signed_num;
          num += (mp_uintmax_t)1;
        }
      }
number:
      /* Supply a default precision if none was given.  */
      if(prec == -1)
        prec = 1;

      /* Put the number in WORK.  */
      w = workend;
      switch(base) {
      case 10:
        while(num > 0) {
          *w-- = (char)('0' + (num % 10));
          num /= 10;
        }
        break;
      default:
        while(num > 0) {
          *w-- = digits[num % base];
          num /= base;
        }
        break;
      }
      width -= (int)(workend - w);
      prec -= (int)(workend - w);

      if(is_alt && base == 8 && prec <= 0) {
        *w-- = '0';
        --width;
      }

      if(prec > 0) {
        width -= prec;
        while(prec-- > 0 && w >= work)
          *w-- = '0';
      }

      if(is_alt && base == 16)
        width -= 2;

      if(is_neg || (flags & FLAGS_SHOWSIGN) || (flags & FLAGS_SPACE))
        --width;

      if(!(flags & FLAGS_LEFT) && !(flags & FLAGS_PAD_NIL))
        while(width-- > 0)
          OUTCHAR(' ');

      if(is_neg)
        OUTCHAR('-');
      else if(flags & FLAGS_SHOWSIGN)
        OUTCHAR('+');
      else if(flags & FLAGS_SPACE)
        OUTCHAR(' ');

      if(is_alt && base == 16) {
        OUTCHAR('0');
        if(flags & FLAGS_UPPER)
          OUTCHAR('X');
        else
          OUTCHAR('x');
      }

      if(!(flags & FLAGS_LEFT) && (flags & FLAGS_PAD_NIL))
        while(width-- > 0)
          OUTCHAR('0');

      /* Write the number.  */
      while(++w <= workend) {
        OUTCHAR(*w);
      }

      if(flags & FLAGS_LEFT)
        while(width-- > 0)
          OUTCHAR(' ');
      break;

    case FORMAT_STRING: {
      const char *str;
      size_t len;

      str = iptr->val.str;
      if(!str) {
        /* Write null string if there is space.  */
        if(prec == -1 || prec >= (int) sizeof(nilstr) - 1) {
          str = nilstr;
          len = sizeof(nilstr) - 1;
          /* Disable quotes around (nil) */
          flags &= ~(unsigned int)FLAGS_ALT;
        }
        else {
          str = "";
          len = 0;
        }
      }
      else if(prec != -1)
        len = (size_t)prec;
      else if(*str == '\0')
        len = 0;
      else
        len = strlen(str);

      width -= (len > INT_MAX) ? INT_MAX : (int)len;

      if(flags & FLAGS_ALT)
        OUTCHAR('"');

      if(!(flags & FLAGS_LEFT))
        while(width-- > 0)
          OUTCHAR(' ');

      for(; len && *str; len--)
        OUTCHAR(*str++);
      if(flags & FLAGS_LEFT)
        while(width-- > 0)
          OUTCHAR(' ');

      if(flags & FLAGS_ALT)
        OUTCHAR('"');
      break;
    }

    case FORMAT_PTR:
      /* Generic pointer.  */
      if(iptr->val.ptr) {
        /* If the pointer is not NULL, write it as a %#x spec.  */
        base = 16;
        digits = (flags & FLAGS_UPPER) ? upper_digits : lower_digits;
        is_alt = TRUE;
        num = (size_t) iptr->val.ptr;
        is_neg = FALSE;
        goto number;
      }
      else {
        /* Write "(nil)" for a nil pointer.  */
        const char *point;

        width -= (int)(sizeof(nilstr) - 1);
        if(flags & FLAGS_LEFT)
          while(width-- > 0)
            OUTCHAR(' ');
        for(point = nilstr; *point != '\0'; ++point)
          OUTCHAR(*point);
        if(!(flags & FLAGS_LEFT))
          while(width-- > 0)
            OUTCHAR(' ');
      }
      break;

    case FORMAT_DOUBLE: {
      char formatbuf[32]="%";
      char *fptr = &formatbuf[1];
      size_t left = sizeof(formatbuf)-strlen(formatbuf);
      int len;

      if(flags & FLAGS_WIDTH)
        width = optr->width;

      if(flags & FLAGS_PREC)
        prec = optr->precision;

      if(flags & FLAGS_LEFT)
        *fptr++ = '-';
      if(flags & FLAGS_SHOWSIGN)
        *fptr++ = '+';
      if(flags & FLAGS_SPACE)
        *fptr++ = ' ';
      if(flags & FLAGS_ALT)
        *fptr++ = '#';

      *fptr = 0;

      if(width >= 0) {
        size_t dlen;
        if(width >= BUFFSIZE)
          width = BUFFSIZE - 1;
        /* RECURSIVE USAGE */
        dlen = (size_t)curl_msnprintf(fptr, left, "%d", width);
        fptr += dlen;
        left -= dlen;
      }
      if(prec >= 0) {
        /* for each digit in the integer part, we can have one less
           precision */
        int maxprec = BUFFSIZE - 1;
        double val = iptr->val.dnum;
        if(prec > maxprec)
          prec = maxprec - 1;
        if(width > 0 && prec <= width)
          maxprec -= width;
        while(val >= 10.0) {
          val /= 10;
          maxprec--;
        }

        if(prec > maxprec)
          prec = maxprec - 1;
        if(prec < 0)
          prec = 0;
        /* RECURSIVE USAGE */
        len = curl_msnprintf(fptr, left, ".%d", prec);
        fptr += len;
      }
      if(flags & FLAGS_LONG)
        *fptr++ = 'l';

      if(flags & FLAGS_FLOATE)
        *fptr++ = (char)((flags & FLAGS_UPPER) ? 'E' : 'e');
      else if(flags & FLAGS_FLOATG)
        *fptr++ = (char)((flags & FLAGS_UPPER) ? 'G' : 'g');
      else
        *fptr++ = 'f';

      *fptr = 0; /* and a final null-termination */

#ifdef __clang__
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wformat-nonliteral"
#endif
      /* NOTE NOTE NOTE!! Not all sprintf implementations return number of
         output characters */
#ifdef HAVE_SNPRINTF
      /* !checksrc! disable LONGLINE */
      /* NOLINTNEXTLINE(clang-analyzer-security.insecureAPI.DeprecatedOrUnsafeBufferHandling) */
      (snprintf)(work, BUFFSIZE, formatbuf, iptr->val.dnum);
#ifdef _WIN32
      /* Old versions of the Windows CRT do not terminate the snprintf output
         buffer if it reaches the max size so we do that here. */
      work[BUFFSIZE - 1] = 0;
#endif
#else
      (sprintf)(work, formatbuf, iptr->val.dnum);
#endif
#ifdef __clang__
#pragma clang diagnostic pop
#endif
      DEBUGASSERT(strlen(work) < BUFFSIZE);
      for(fptr = work; *fptr; fptr++)
        OUTCHAR(*fptr);
      break;
    }

    case FORMAT_INTPTR:
      /* Answer the count of characters written.  */
#ifdef HAVE_LONG_LONG_TYPE
      if(flags & FLAGS_LONGLONG)
        *(LONG_LONG_TYPE *) iptr->val.ptr = (LONG_LONG_TYPE)done;
      else
#endif
        if(flags & FLAGS_LONG)
          *(long *) iptr->val.ptr = (long)done;
      else if(!(flags & FLAGS_SHORT))
        *(int *) iptr->val.ptr = (int)done;
      else
        *(short *) iptr->val.ptr = (short)done;
      break;

    default:
      break;
    }
  }
  return done;
}